

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

bool ImGui::IsItemHovered(ImGuiHoveredFlags flags)

{
  uint uVar1;
  ImGuiWindow *window_00;
  ImGuiContext *pIVar2;
  bool bVar3;
  ImGuiItemStatusFlags status_flags;
  ImGuiWindow *window;
  ImGuiContext *g;
  ImGuiHoveredFlags flags_local;
  
  pIVar2 = GImGui;
  window_00 = GImGui->CurrentWindow;
  if (((GImGui->NavDisableMouseHover & 1U) == 0) || ((GImGui->NavDisableHighlight & 1U) != 0)) {
    uVar1 = (window_00->DC).LastItemStatusFlags;
    if ((uVar1 & 1) == 0) {
      g._7_1_ = false;
    }
    else {
      if ((flags & 3U) != 0) {
        __assert_fail("(flags & (ImGuiHoveredFlags_RootWindow | ImGuiHoveredFlags_ChildWindows)) == 0"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/imgui.cpp"
                      ,0xc5f,"bool ImGui::IsItemHovered(ImGuiHoveredFlags)");
      }
      if (((GImGui->HoveredWindow == window_00) || ((uVar1 & 0x80) != 0)) || ((flags & 0x40U) != 0))
      {
        if ((((flags & 0x20U) == 0) && (GImGui->ActiveId != 0)) &&
           ((GImGui->ActiveId != (window_00->DC).LastItemId &&
            (((GImGui->ActiveIdAllowOverlap & 1U) == 0 && (GImGui->ActiveId != window_00->MoveId))))
           )) {
          g._7_1_ = false;
        }
        else {
          bVar3 = IsWindowContentHoverable(window_00,flags);
          if (bVar3) {
            if (((pIVar2->CurrentItemFlags & 4U) == 0) || ((flags & 0x80U) != 0)) {
              if (((window_00->DC).LastItemId == window_00->MoveId) &&
                 ((window_00->WriteAccessed & 1U) != 0)) {
                g._7_1_ = false;
              }
              else {
                g._7_1_ = true;
              }
            }
            else {
              g._7_1_ = false;
            }
          }
          else {
            g._7_1_ = false;
          }
        }
      }
      else {
        g._7_1_ = false;
      }
    }
  }
  else {
    g._7_1_ = IsItemFocused();
  }
  return g._7_1_;
}

Assistant:

bool ImGui::IsItemHovered(ImGuiHoveredFlags flags)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    if (g.NavDisableMouseHover && !g.NavDisableHighlight)
        return IsItemFocused();

    // Test for bounding box overlap, as updated as ItemAdd()
    ImGuiItemStatusFlags status_flags = window->DC.LastItemStatusFlags;
    if (!(status_flags & ImGuiItemStatusFlags_HoveredRect))
        return false;
    IM_ASSERT((flags & (ImGuiHoveredFlags_RootWindow | ImGuiHoveredFlags_ChildWindows)) == 0);   // Flags not supported by this function

    // Test if we are hovering the right window (our window could be behind another window)
    // [2021/03/02] Reworked / reverted the revert, finally. Note we want e.g. BeginGroup/ItemAdd/EndGroup to work as well. (#3851)
    // [2017/10/16] Reverted commit 344d48be3 and testing RootWindow instead. I believe it is correct to NOT test for RootWindow but this leaves us unable
    // to use IsItemHovered() after EndChild() itself. Until a solution is found I believe reverting to the test from 2017/09/27 is safe since this was
    // the test that has been running for a long while.
    if (g.HoveredWindow != window && (status_flags & ImGuiItemStatusFlags_HoveredWindow) == 0)
        if ((flags & ImGuiHoveredFlags_AllowWhenOverlapped) == 0)
            return false;

    // Test if another item is active (e.g. being dragged)
    if ((flags & ImGuiHoveredFlags_AllowWhenBlockedByActiveItem) == 0)
        if (g.ActiveId != 0 && g.ActiveId != window->DC.LastItemId && !g.ActiveIdAllowOverlap && g.ActiveId != window->MoveId)
            return false;

    // Test if interactions on this window are blocked by an active popup or modal.
    // The ImGuiHoveredFlags_AllowWhenBlockedByPopup flag will be tested here.
    if (!IsWindowContentHoverable(window, flags))
        return false;

    // Test if the item is disabled
    if ((g.CurrentItemFlags & ImGuiItemFlags_Disabled) && !(flags & ImGuiHoveredFlags_AllowWhenDisabled))
        return false;

    // Special handling for calling after Begin() which represent the title bar or tab.
    // When the window is collapsed (SkipItems==true) that last item will never be overwritten so we need to detect the case.
    if (window->DC.LastItemId == window->MoveId && window->WriteAccessed)
        return false;
    return true;
}